

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnV128ConstExpr
          (BinaryReaderInterp *this,v128 value_bits)

{
  v128 val;
  bool bVar1;
  Result RVar2;
  Type local_58;
  Location local_50;
  Enum local_2c;
  BinaryReaderInterp *local_28;
  BinaryReaderInterp *this_local;
  undefined1 uStack_18;
  undefined1 uStack_17;
  undefined1 uStack_16;
  undefined1 uStack_15;
  v128 value_bits_local;
  
  value_bits_local.v._0_8_ = value_bits.v._8_8_;
  register0x00000030 = value_bits.v._0_8_;
  local_28 = this;
  GetLocation(&local_50,this);
  Type::Type(&local_58,V128);
  local_2c = (Enum)SharedValidator::OnConst(&this->validator_,&local_50,local_58);
  bVar1 = Failed((Result)local_2c);
  if (bVar1) {
    Result::Result((Result *)(value_bits_local.v + 8),Error);
  }
  else {
    val.v[8] = value_bits_local.v[0];
    val.v[9] = value_bits_local.v[1];
    val.v[10] = value_bits_local.v[2];
    val.v[0xb] = value_bits_local.v[3];
    val.v[0xc] = value_bits_local.v[4];
    val.v[0xd] = value_bits_local.v[5];
    val.v[0xe] = value_bits_local.v[6];
    val.v[0xf] = value_bits_local.v[7];
    val.v[0] = this_local._4_1_;
    val.v[1] = this_local._5_1_;
    val.v[2] = this_local._6_1_;
    val.v[3] = this_local._7_1_;
    val.v[4] = uStack_18;
    val.v[5] = uStack_17;
    val.v[6] = uStack_16;
    val.v[7] = uStack_15;
    Istream::Emit(this->istream_,V128Const,val);
    Result::Result((Result *)(value_bits_local.v + 8),Ok);
  }
  RVar2.enum_._0_1_ = value_bits_local.v[8];
  RVar2.enum_._1_1_ = value_bits_local.v[9];
  RVar2.enum_._2_1_ = value_bits_local.v[10];
  RVar2.enum_._3_1_ = value_bits_local.v[0xb];
  return (Result)RVar2.enum_;
}

Assistant:

Result BinaryReaderInterp::OnV128ConstExpr(v128 value_bits) {
  CHECK_RESULT(validator_.OnConst(GetLocation(), Type::V128));
  istream_.Emit(Opcode::V128Const, value_bits);
  return Result::Ok;
}